

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O3

ssize_t __thiscall
DomCustomWidgets::read(DomCustomWidgets *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  DomCustomWidget *this_00;
  char16_t *__nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QStringView QVar2;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_78;
  QString local_60;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QXmlStreamReader::error();
  if (iVar1 == 0) {
    do {
      iVar1 = QXmlStreamReader::readNext();
      if (iVar1 == 4) {
        local_48.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_48.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = (QStringView)QXmlStreamReader::name();
        QVar2.m_data = L"customwidget";
        QVar2.m_size = 0xc;
        __nbytes_00 = L"customwidget";
        iVar1 = QtPrivate::compareStrings(local_48,QVar2,CaseInsensitive);
        if (iVar1 == 0) {
          this_00 = (DomCustomWidget *)operator_new(0x90);
          memset(this_00,0,0x90);
          DomCustomWidget::read(this_00,__fd,__buf_00,(size_t)__nbytes_00);
          local_60.d.d = (Data *)this_00;
          QtPrivate::QPodArrayOps<DomCustomWidget*>::emplace<DomCustomWidget*&>
                    ((QPodArrayOps<DomCustomWidget*> *)&this->m_customWidget,
                     (this->m_customWidget).d.size,(DomCustomWidget **)&local_60);
          QList<DomCustomWidget_*>::end(&this->m_customWidget);
        }
        else {
          local_78.a.m_size = 0x13;
          local_78.a.m_data = "Unexpected element ";
          local_78.b = &local_48;
          QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                    (&local_60,&local_78);
          QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
          if ((DomCustomWidget *)local_60.d.d != (DomCustomWidget *)0x0) {
            LOCK();
            *(uint *)&(local_60.d.d)->super_QArrayData =
                 *(uint *)&(local_60.d.d)->super_QArrayData - 1;
            UNLOCK();
            if (*(uint *)&(local_60.d.d)->super_QArrayData == 0) {
              QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
      else if (iVar1 == 5) break;
      iVar1 = QXmlStreamReader::error();
    } while (iVar1 == 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomCustomWidgets::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"customwidget"_s, Qt::CaseInsensitive)) {
                auto *v = new DomCustomWidget();
                v->read(reader);
                m_customWidget.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}